

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

DivideBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_dividebroadcastable(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x37a) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x37a;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    DivideBroadcastableLayerParams::DivideBroadcastableLayerParams(this_00.dividebroadcastable_);
    (this->layer_).dividebroadcastable_ = (DivideBroadcastableLayerParams *)this_00;
  }
  return (DivideBroadcastableLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::DivideBroadcastableLayerParams* NeuralNetworkLayer::mutable_dividebroadcastable() {
  if (!has_dividebroadcastable()) {
    clear_layer();
    set_has_dividebroadcastable();
    layer_.dividebroadcastable_ = new ::CoreML::Specification::DivideBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.divideBroadcastable)
  return layer_.dividebroadcastable_;
}